

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlParseJson.c
# Opt level: O0

JL_STATUS ParseForDictionary(ParseParameters *Params,size_t *pErrorAtPos)

{
  char local_29;
  ParseStack *pPStack_28;
  char nextChar;
  ParseStack *currentStack;
  size_t *psStack_18;
  JL_STATUS jlStatus;
  size_t *pErrorAtPos_local;
  ParseParameters *Params_local;
  
  pPStack_28 = Params->Stack + Params->StackIndex;
  if ((pPStack_28->ProcessedFirstItem & 1U) == 0) {
    Params->StringIndex = Params->StringIndex + 1;
    pPStack_28->DictionaryScanState = DICT_SCAN_STATE_NEED_KEY;
  }
  psStack_18 = pErrorAtPos;
  pErrorAtPos_local = (size_t *)Params;
  currentStack._4_4_ = SkipWhiteSpace(Params,&local_29);
  if (currentStack._4_4_ == JL_STATUS_SUCCESS) {
    if (pPStack_28->DictionaryScanState == DICT_SCAN_STATE_NEED_KEY) {
      if ((local_29 == '\"') || (((pErrorAtPos_local[5] & 1) != 0 && (local_29 == '\'')))) {
        currentStack._4_4_ = ParseKeyName((ParseParameters *)pErrorAtPos_local,false);
        pPStack_28->DictionaryScanState = DICT_SCAN_STATE_NEED_COLON;
      }
      else if (((pErrorAtPos_local[5] & 1) == 0) ||
              ((((local_29 != '_' && (local_29 != '$')) && ((local_29 < 'a' || ('z' < local_29))))
               && ((local_29 < 'A' || ('Z' < local_29)))))) {
        if ((local_29 == '}') &&
           (((pPStack_28->ProcessedFirstItem & 1U) == 0 || ((pErrorAtPos_local[5] & 1) != 0)))) {
          pPStack_28->FinishedProcessing = true;
          pPStack_28->DictionaryScanState = DICT_SCAN_STATE_NONE;
          pErrorAtPos_local[4] = pErrorAtPos_local[4] + 1;
        }
        else {
          currentStack._4_4_ = JL_STATUS_INVALID_DATA;
        }
      }
      else {
        currentStack._4_4_ = ParseKeyName((ParseParameters *)pErrorAtPos_local,true);
        pPStack_28->DictionaryScanState = DICT_SCAN_STATE_NEED_COLON;
      }
    }
    else if (pPStack_28->DictionaryScanState == DICT_SCAN_STATE_NEED_COLON) {
      if (local_29 == ':') {
        pPStack_28->DictionaryScanState = DICT_SCAN_STATE_NEED_VALUE;
        pPStack_28->ScanForSubObjects = true;
        pErrorAtPos_local[4] = pErrorAtPos_local[4] + 1;
      }
      else {
        currentStack._4_4_ = JL_STATUS_INVALID_DATA;
      }
    }
    else if (pPStack_28->DictionaryScanState == DICT_SCAN_STATE_NEED_VALUE) {
      pPStack_28->DictionaryScanState = DICT_SCAN_STATE_NEED_COMMA_OR_END;
      pPStack_28->ScanForSubObjects = false;
    }
    else if (pPStack_28->DictionaryScanState == DICT_SCAN_STATE_NEED_COMMA_OR_END) {
      if (local_29 == ',') {
        pPStack_28->DictionaryScanState = DICT_SCAN_STATE_NEED_KEY;
        pErrorAtPos_local[4] = pErrorAtPos_local[4] + 1;
      }
      else if (local_29 == '}') {
        pPStack_28->FinishedProcessing = true;
        pPStack_28->DictionaryScanState = DICT_SCAN_STATE_NONE;
        pErrorAtPos_local[4] = pErrorAtPos_local[4] + 1;
      }
      else {
        currentStack._4_4_ = JL_STATUS_INVALID_DATA;
      }
    }
    if ((currentStack._4_4_ != JL_STATUS_SUCCESS) && (pPStack_28->CurrentKeyName != (char *)0x0)) {
      WjTestLib_Free(pPStack_28->CurrentKeyName);
      pPStack_28->CurrentKeyName = (char *)0x0;
    }
    pPStack_28->ProcessedFirstItem = true;
    if (((currentStack._4_4_ != JL_STATUS_SUCCESS) && (psStack_18 != (size_t *)0x0)) &&
       (*psStack_18 == 0)) {
      *psStack_18 = pErrorAtPos_local[4];
    }
  }
  return currentStack._4_4_;
}

Assistant:

static
JL_STATUS
    ParseForDictionary
    (
        ParseParameters*    Params,
        size_t*             pErrorAtPos     // OPTIONAL
    )
{
    JL_STATUS jlStatus;
    ParseStack* currentStack = &Params->Stack[Params->StackIndex];
    char nextChar;

    if( !currentStack->ProcessedFirstItem )
    {
        // Skip past opening curly bracket
        Params->StringIndex += 1;
        currentStack->DictionaryScanState = DICT_SCAN_STATE_NEED_KEY;
    }

    jlStatus = SkipWhiteSpace( Params, &nextChar );
    if( JL_STATUS_SUCCESS == jlStatus )
    {
        if( DICT_SCAN_STATE_NEED_KEY == currentStack->DictionaryScanState )
        {
            if(     '\"' == nextChar
                ||  ( Params->IsJson5 && '\'' == nextChar ) )
            {
                // Read key
                jlStatus = ParseKeyName( Params, false );
                currentStack->DictionaryScanState = DICT_SCAN_STATE_NEED_COLON;
            }
            else if( Params->IsJson5 &&
                     (      '_' == nextChar
                       ||   '$' == nextChar
                       ||   ( nextChar >= 'a' && nextChar <= 'z' )
                       ||   ( nextChar >= 'A' && nextChar <= 'Z' )
                       ) )
            {
                // Json5 bareword key
                jlStatus = ParseKeyName( Params, true );
                currentStack->DictionaryScanState = DICT_SCAN_STATE_NEED_COLON;
            }
            else if( '}' == nextChar && ( !currentStack->ProcessedFirstItem || Params->IsJson5 ) )
            {
                // This means an empty dictionary or, in Json5, there was a trailing comma
                currentStack->FinishedProcessing = true;
                currentStack->DictionaryScanState = DICT_SCAN_STATE_NONE;
                Params->StringIndex += 1;   // Move past end curly bracket
            }
            else
            {
                jlStatus = JL_STATUS_INVALID_DATA;
            }
        }
        else if( DICT_SCAN_STATE_NEED_COLON == currentStack->DictionaryScanState )
        {
            if( ':' == nextChar )
            {
                currentStack->DictionaryScanState = DICT_SCAN_STATE_NEED_VALUE;
                currentStack->ScanForSubObjects = true;
                Params->StringIndex += 1;   // Move past colon
            }
            else
            {
                jlStatus = JL_STATUS_INVALID_DATA;
            }
        }
        else if( DICT_SCAN_STATE_NEED_VALUE == currentStack->DictionaryScanState )
        {
            // We will have added object already because ScanForSubObjects was set and
            // value processed in main loop. So we just need to skip on to the next state
            currentStack->DictionaryScanState = DICT_SCAN_STATE_NEED_COMMA_OR_END;
            currentStack->ScanForSubObjects = false;
        }
        else if( DICT_SCAN_STATE_NEED_COMMA_OR_END == currentStack->DictionaryScanState )
        {
            if( ',' == nextChar )
            {
                // Set back to scanning for a new keyname
                currentStack->DictionaryScanState = DICT_SCAN_STATE_NEED_KEY;
                Params->StringIndex += 1;   // Move past comma
            }
            else if( '}' == nextChar )
            {
                // End dictionary
                currentStack->FinishedProcessing = true;
                currentStack->DictionaryScanState = DICT_SCAN_STATE_NONE;
                Params->StringIndex += 1;   // Move past end curly bracket
            }
            else
            {
                jlStatus = JL_STATUS_INVALID_DATA;
            }
        }

        if(     JL_STATUS_SUCCESS != jlStatus
            &&  NULL != currentStack->CurrentKeyName )
        {
            JlFree( currentStack->CurrentKeyName );
            currentStack->CurrentKeyName = NULL;
        }

        currentStack->ProcessedFirstItem = true;

        if(     JL_STATUS_SUCCESS != jlStatus
            &&  NULL != pErrorAtPos
            &&  0 == *pErrorAtPos )
        {
            *pErrorAtPos = Params->StringIndex;
        }
    }

    return jlStatus;
}